

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_format(SwapchainBuilder *this,VkSurfaceFormatKHR format)

{
  VkSurfaceFormatKHR local_10;
  
  local_10 = format;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::push_back
            (&(this->info).desired_formats,&local_10);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_format(VkSurfaceFormatKHR format) {
    info.desired_formats.push_back(format);
    return *this;
}